

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int toLocaltime(DateTime *p,sqlite3_context *pCtx)

{
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  sqlite3_mutex *psVar4;
  tm *ptVar5;
  int iVar6;
  int iVar7;
  tm sLocal;
  DateTime x;
  
  sLocal.tm_isdst = 0;
  sLocal._36_4_ = 0;
  sLocal.tm_gmtoff = 0;
  sLocal.tm_mon = 0;
  sLocal.tm_year = 0;
  sLocal.tm_wday = 0;
  sLocal.tm_yday = 0;
  sLocal.tm_sec = 0;
  sLocal.tm_min = 0;
  sLocal.tm_hour = 0;
  sLocal.tm_mday = 0;
  sLocal.tm_zone = (char *)0x0;
  computeJD(p);
  if (p->iJD - 0xc1bc387b0a01U < 0xfffffe0c05d817ff) {
    x.iJD = p->iJD;
    x.Y = p->Y;
    x.M = p->M;
    x.D = p->D;
    x.h = p->h;
    x.m = p->m;
    x.tz = p->tz;
    x.s = p->s;
    x.validJD = p->validJD;
    x.rawS = p->rawS;
    x.validYMD = p->validYMD;
    x.validHMS = p->validHMS;
    x.validTZ = p->validTZ;
    x.tzSet = p->tzSet;
    x.isError = p->isError;
    x._47_1_ = p->field_0x2f;
    computeYMD_HMS(&x);
    iVar6 = x.Y % 4 + 2000;
    iVar7 = x.Y - iVar6;
    x.Y = iVar6;
    x._40_8_ = x._40_8_ & 0xffffffffffffff00;
    computeJD(&x);
    uVar3 = x.iJD / 1000;
    iVar7 = iVar7 + 0x76c;
  }
  else {
    uVar3 = (ulong)p->iJD / 1000;
    iVar7 = 0x76c;
  }
  x.iJD = uVar3 - 0x3118a36940;
  bVar1 = true;
  if (sqlite3Config.bCoreMutex == '\0') {
LAB_001bdff6:
    psVar4 = (sqlite3_mutex *)0x0;
  }
  else {
    psVar4 = (*sqlite3Config.mutex.xMutexAlloc)(2);
    if (psVar4 == (sqlite3_mutex *)0x0) goto LAB_001bdff6;
    (*sqlite3Config.mutex.xMutexEnter)(psVar4);
    bVar1 = false;
  }
  ptVar5 = localtime(&x.iJD);
  if (sqlite3Config.bLocaltimeFault == 0) {
    if (ptVar5 != (tm *)0x0) {
LAB_001be036:
      sLocal.tm_zone = ptVar5->tm_zone;
      sLocal.tm_sec = ptVar5->tm_sec;
      sLocal.tm_min = ptVar5->tm_min;
      sLocal.tm_hour = ptVar5->tm_hour;
      sLocal.tm_mday = ptVar5->tm_mday;
      sLocal.tm_mon = ptVar5->tm_mon;
      sLocal.tm_year = ptVar5->tm_year;
      sLocal.tm_wday = ptVar5->tm_wday;
      sLocal.tm_yday = ptVar5->tm_yday;
      sLocal.tm_isdst = ptVar5->tm_isdst;
      sLocal._36_4_ = *(undefined4 *)&ptVar5->field_0x24;
      sLocal.tm_gmtoff = ptVar5->tm_gmtoff;
      bVar2 = true;
      goto LAB_001be066;
    }
  }
  else if (sqlite3Config.xAltLocaltime != (_func_int_void_ptr_void_ptr *)0x0) {
    iVar6 = (*sqlite3Config.xAltLocaltime)(&x,&sLocal);
    ptVar5 = (tm *)&sLocal;
    if (iVar6 == 0) goto LAB_001be036;
  }
  bVar2 = false;
LAB_001be066:
  if (!bVar1) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar4);
  }
  if (!bVar2) {
    sqlite3_result_error(pCtx,"local time unavailable",-1);
  }
  else {
    p->Y = iVar7 + sLocal.tm_year;
    p->M = sLocal.tm_mon + 1;
    p->D = sLocal.tm_mday;
    p->h = sLocal.tm_hour;
    p->m = sLocal.tm_min;
    p->s = (double)(p->iJD % 1000) * 0.001 + (double)sLocal.tm_sec;
    p->validJD = '\0';
    p->rawS = '\0';
    p->validYMD = '\x01';
    p->validHMS = '\x01';
    p->validTZ = '\0';
    p->isError = '\0';
  }
  return (uint)!bVar2;
}

Assistant:

static int toLocaltime(
  DateTime *p,                   /* Date at which to calculate offset */
  sqlite3_context *pCtx          /* Write error here if one occurs */
){
  time_t t;
  struct tm sLocal;
  int iYearDiff;

  /* Initialize the contents of sLocal to avoid a compiler warning. */
  memset(&sLocal, 0, sizeof(sLocal));

  computeJD(p);
  if( p->iJD<2108667600*(i64)100000 /* 1970-01-01 */
   || p->iJD>2130141456*(i64)100000 /* 2038-01-18 */
  ){
    /* EVIDENCE-OF: R-55269-29598 The localtime_r() C function normally only
    ** works for years between 1970 and 2037. For dates outside this range,
    ** SQLite attempts to map the year into an equivalent year within this
    ** range, do the calculation, then map the year back.
    */
    DateTime x = *p;
    computeYMD_HMS(&x);
    iYearDiff = (2000 + x.Y%4) - x.Y;
    x.Y += iYearDiff;
    x.validJD = 0;
    computeJD(&x);
    t = (time_t)(x.iJD/1000 -  21086676*(i64)10000);
  }else{
    iYearDiff = 0;
    t = (time_t)(p->iJD/1000 -  21086676*(i64)10000);
  }
  if( osLocaltime(&t, &sLocal) ){
    sqlite3_result_error(pCtx, "local time unavailable", -1);
    return SQLITE_ERROR;
  }
  p->Y = sLocal.tm_year + 1900 - iYearDiff;
  p->M = sLocal.tm_mon + 1;
  p->D = sLocal.tm_mday;
  p->h = sLocal.tm_hour;
  p->m = sLocal.tm_min;
  p->s = sLocal.tm_sec + (p->iJD%1000)*0.001;
  p->validYMD = 1;
  p->validHMS = 1;
  p->validJD = 0;
  p->rawS = 0;
  p->validTZ = 0;
  p->isError = 0;
  return SQLITE_OK;
}